

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O3

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,ReturnNode *node)

{
  _Storage<TypeName,_true> _Var1;
  ExpressionNode *pEVar2;
  optional<TypeName> *poVar3;
  _Elt_pointer pRVar4;
  bool bVar5;
  TypeChecker typeChecker;
  TypeChecker local_30;
  
  pEVar2 = (node->value_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,this);
  local_30.symbols_ = &this->symbols_;
  local_30.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_0014fef0;
  local_30.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  pEVar2 = (node->value_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,&local_30);
  poVar3 = TypeChecker::getType(&local_30);
  if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged == true) {
    poVar3 = TypeChecker::getType(&local_30);
    if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    _Var1 = (poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
            super__Optional_payload_base<TypeName>._M_payload;
    pRVar4 = (this->hasReturn_).c.
             super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pRVar4 == (this->hasReturn_).c.
                  super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pRVar4 = (this->hasReturn_).c.
               super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
    }
    pRVar4[-1].hasReturn = true;
    pRVar4[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName>._M_payload = _Var1;
    bVar5 = true;
  }
  else {
    pRVar4 = (this->hasReturn_).c.
             super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pRVar4 == (this->hasReturn_).c.
                  super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pRVar4 = (this->hasReturn_).c.
               super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
    }
    pRVar4[-1].hasReturn = true;
    bVar5 = false;
  }
  pRVar4[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = bVar5;
  return;
}

Assistant:

void SemanticAnalyser::visit(const ReturnNode& node) 
{
  node.getValue().accept(*this);
  TypeChecker typeChecker{symbols_};
  node.getValue().accept(typeChecker);

  if(typeChecker.getType().has_value())
    hasReturn_.top() = ReturnInfo{typeChecker.getType().value()};
  else
    hasReturn_.top() = ReturnInfo{true};
}